

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int parse_escaped_codeunit(xmlRegParserCtxtPtr ctxt)

{
  uint uVar1;
  int iVar2;
  int local_20;
  int cur;
  int i;
  int val;
  xmlRegParserCtxtPtr ctxt_local;
  
  cur = 0;
  local_20 = 0;
  do {
    if (3 < local_20) {
      return cur;
    }
    ctxt->cur = ctxt->cur + 1;
    uVar1 = (uint)*ctxt->cur;
    if ((uVar1 < 0x30) || (0x39 < uVar1)) {
      if ((uVar1 < 0x41) || (0x46 < uVar1)) {
        if ((uVar1 < 0x61) || (0x66 < uVar1)) {
          ctxt->error = 0x5aa;
          xmlRegexpErrCompile(ctxt,"Expecting hex digit");
          return -1;
        }
        iVar2 = uVar1 - 0x57;
      }
      else {
        iVar2 = uVar1 - 0x37;
      }
    }
    else {
      iVar2 = uVar1 - 0x30;
    }
    cur = iVar2 + cur * 0x10;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static int parse_escaped_codeunit(xmlRegParserCtxtPtr ctxt)
{
    int val = 0, i, cur;
    for (i = 0; i < 4; i++) {
	NEXT;
	val *= 16;
	cur = CUR;
	if (cur >= '0' && cur <= '9') {
	    val += cur - '0';
	} else if (cur >= 'A' && cur <= 'F') {
	    val += cur - 'A' + 10;
	} else if (cur >= 'a' && cur <= 'f') {
	    val += cur - 'a' + 10;
	} else {
	    ERROR("Expecting hex digit");
	    return -1;
	}
    }
    return val;
}